

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O0

curltime Curl_now(void)

{
  int iVar1;
  curltime cVar2;
  undefined1 local_38 [8];
  timespec tsnow;
  timeval now;
  curltime cnow;
  
  iVar1 = clock_gettime(4,(timespec *)local_38);
  if (iVar1 == 0) {
    now.tv_usec = (__suseconds_t)local_38;
    cnow.tv_sec._0_4_ = (undefined4)(tsnow.tv_sec / 1000);
  }
  else {
    iVar1 = clock_gettime(1,(timespec *)local_38);
    if (iVar1 == 0) {
      now.tv_usec = (__suseconds_t)local_38;
      cnow.tv_sec._0_4_ = (undefined4)(tsnow.tv_sec / 1000);
    }
    else {
      gettimeofday((timeval *)&tsnow.tv_nsec,(__timezone_ptr_t)0x0);
      now.tv_usec = tsnow.tv_nsec;
      cnow.tv_sec._0_4_ = (undefined4)now.tv_sec;
    }
  }
  cVar2.tv_usec = (undefined4)cnow.tv_sec;
  cVar2.tv_sec = now.tv_usec;
  cVar2._12_4_ = 0;
  return cVar2;
}

Assistant:

struct curltime Curl_now(void)
{
  /*
  ** Monotonic timer on macOS is provided by mach_absolute_time(), which
  ** returns time in Mach "absolute time units," which are platform-dependent.
  ** To convert to nanoseconds, one must use conversion factors specified by
  ** mach_timebase_info().
  */
  static mach_timebase_info_data_t timebase;
  struct curltime cnow;
  uint64_t usecs;

  if(0 == timebase.denom)
    (void) mach_timebase_info(&timebase);

  usecs = mach_absolute_time();
  usecs *= timebase.numer;
  usecs /= timebase.denom;
  usecs /= 1000;

  cnow.tv_sec = usecs / 1000000;
  cnow.tv_usec = (int)(usecs % 1000000);

  return cnow;
}